

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O1

Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>
capnp::readMessage(AsyncInputStream *input,ReaderOptions options,ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  PromiseArena *pPVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this;
  Promise<bool> promise;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  undefined1 local_58 [8];
  _func_int **local_50;
  PromiseArena *local_48;
  ReaderOptions local_40;
  
  local_40.traversalLimitInWords = options._8_8_;
  local_40.nestingLimit = (int)scratchSpace.ptr;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((kj *)&local_50,&local_40);
  pPVar3 = local_48;
  anon_unknown_0::AsyncMessageReader::read
            ((AsyncMessageReader *)local_58,(int)local_48,(void *)options.traversalLimitInWords,
             scratchSpace.size_);
  auVar2 = local_58;
  local_48 = (PromiseArena *)0x0;
  pPVar1 = ((PromiseArenaMember *)local_58)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58 - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:193:23)>
               ::anon_class_16_1_69694a01_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_006f6ff0;
    *(_func_int ***)((long)pvVar4 + 0x3f0) = local_50;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((PromiseArenaMember *)local_58)->arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)((long)local_58 + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:193:23)>
               ::anon_class_16_1_69694a01_for_func::operator());
    ((PromiseArenaMember *)((long)auVar2 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006f6ff0;
    ((PromiseArenaMember *)((long)auVar2 + -0x10))->_vptr_PromiseArenaMember = local_50;
    ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = pPVar3;
    ((PromiseArenaMember *)((long)auVar2 + -0x30))->arena = pPVar1;
  }
  auVar2 = local_58;
  input->_vptr_AsyncInputStream = (_func_int **)this;
  if (local_58 != (undefined1  [8])0x0) {
    local_58 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Own<MessageReader>> readMessage(
    kj::AsyncInputStream& input, ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->read(input, scratchSpace);
  return promise.then([reader = kj::mv(reader)](bool success) mutable -> kj::Own<MessageReader> {
    if (!success) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
    }
    return kj::mv(reader);
  });
}